

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTreeTest.cc
# Opt level: O2

void run_randomized_test(void)

{
  FILE *pFVar1;
  size_t sVar2;
  int iVar3;
  time_t tVar4;
  size_t sVar5;
  size_type sVar6;
  size_type sVar7;
  long lVar8;
  pair<phosg::Vector2<long>,_long> *it;
  _Map_pointer pppNVar9;
  long lVar10;
  bool bVar11;
  pair<std::_Rb_tree_iterator<std::pair<long,_long>_>,_bool> pVar12;
  KDTree<phosg::Vector2<long>,_long> t;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_1c8;
  Node **ppNStack_1c0;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  remaining_points;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_168;
  anon_union_8_2_94730038_for_Vector2<long>_3 aaStack_160 [3];
  Iterator __end1;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  points;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_a8;
  undefined8 local_a0;
  Iterator local_98;
  
  puts("-- randomized");
  puts("--   construction/insert");
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  points._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &points._M_t._M_impl.super__Rb_tree_header._M_header;
  points._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  points._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  t.root = (Node *)0x0;
  t.node_count = 0;
  points._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  points._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       points._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (sVar2 = t.node_count, pFVar1 = _stderr,
        points._M_t._M_impl.super__Rb_tree_header._M_node_count < 1000) {
    iVar3 = rand();
    lVar8 = (long)(iVar3 % 1000);
    iVar3 = rand();
    lVar10 = (long)(iVar3 % 1000);
    remaining_points._M_t._M_impl._0_8_ = lVar8;
    remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = lVar10;
    pVar12 = std::
             _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
             ::_M_emplace_unique<std::pair<long,long>>
                       ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                         *)&points,(pair<long,_long> *)&remaining_points);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __end1.pending.
      super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(lVar10 * lVar8);
      remaining_points._M_t._M_impl._0_8_ = lVar8;
      remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = lVar10;
      phosg::KDTree<phosg::Vector2<long>,_long>::insert
                (&local_98,&t,(Vector2<long> *)&remaining_points,(long *)&__end1);
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_98);
    }
  }
  sVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::depth(&t);
  fprintf(pFVar1,"--     tree: size=%zu, depth=%zu\n",sVar2,sVar5);
  puts("--   within");
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::_Rb_tree(&remaining_points._M_t,&points._M_t);
  local_1c8.x = 0xfa;
  ppNStack_1c0 = (Node **)0xfa;
  local_a8.x = 0x2ee;
  local_a0 = 0x2ee;
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            ((vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
              *)&__end1,&t,(Vector2<long> *)&local_1c8,(Vector2<long> *)&local_a8);
  for (pppNVar9 = __end1.pending.
                  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_map;
      pppNVar9 !=
      (_Map_pointer)
      __end1.pending.
      super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ._M_impl.super__Deque_impl_data._M_map_size; pppNVar9 = pppNVar9 + 3) {
    phosg::expect_generic
              (0xf9 < (long)*pppNVar9,"it.first.x < 250",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x24);
    phosg::expect_generic
              ((long)*pppNVar9 < 0x2ee,"it.first.x >= 750",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x25);
    phosg::expect_generic
              (0xf9 < (long)pppNVar9[1],"it.first.y < 250",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x26);
    phosg::expect_generic
              ((long)pppNVar9[1] < 0x2ee,"it.first.y >= 750",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x27);
    local_1c8.x = (long)*pppNVar9;
    ppNStack_1c0 = pppNVar9[1];
    sVar6 = std::
            _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::erase(&remaining_points._M_t,(key_type *)&local_1c8);
    phosg::expect_generic
              (sVar6 == 1,"1 != remaining_points.erase(make_pair(it.first.x, it.first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x28);
  }
  std::
  _Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
                   *)&__end1);
  for (; (_Rb_tree_header *)remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
         &remaining_points._M_t._M_impl.super__Rb_tree_header;
      remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment
                     (remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._M_left)) {
    bVar11 = true;
    if (0xfffffffffffffe0b <
        *(long *)(remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) -
        0x2eeU) {
      bVar11 = (undefined1 *)
               ((long)&remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                       _M_parent[-0x18]._M_left + 2U) < (undefined1 *)0xfffffffffffffe0c;
    }
    phosg::expect_generic
              (bVar11,
               "!((it.first < 250) || (it.first >= 750) || (it.second < 250) || (it.second >= 750))"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x2b);
  }
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~_Rb_tree(&remaining_points._M_t);
  puts("--   erase 1");
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&remaining_points,t.root);
  while( true ) {
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(&__end1,(Node *)0x0);
    bVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                       ((Iterator *)&remaining_points,&__end1);
    std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                    *)&__end1);
    if (!bVar11) break;
    __end1.pending.
    super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT44(local_168.x._4_4_,local_168.x._0_4_);
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::count(&points,(key_type *)&__end1);
    phosg::expect_generic
              (sVar7 == 1,"1 != points.count(make_pair(it->first.x, it->first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x33);
    if (((undefined4)aaStack_160[0].y + local_168.x._0_4_ & 1) == 0) {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&remaining_points)
      ;
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance(&t,(Iterator *)&remaining_points);
    }
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&remaining_points);
  sVar2 = t.node_count;
  pFVar1 = _stderr;
  sVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::depth(&t);
  fprintf(pFVar1,"--     tree: size=%zu, depth=%zu\n",sVar2,sVar5);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&remaining_points,t.root);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(&__end1,(Node *)0x0);
  while (bVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                            ((Iterator *)&remaining_points,&__end1), bVar11) {
    local_1c8.x._4_4_ = local_168.x._4_4_;
    local_1c8.x._0_4_ = local_168.x._0_4_;
    ppNStack_1c0 = (Node **)CONCAT44(aaStack_160[0].y._4_4_,(undefined4)aaStack_160[0].y);
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::count(&points,(key_type *)&local_1c8);
    phosg::expect_generic
              (sVar7 == 1,"1 != points.count(make_pair(it.first.x, it.first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x3c);
    phosg::expect_generic
              (((undefined4)aaStack_160[0].y + local_168.x._0_4_ & 1) == 0,
               "0 != (it.first.x + it.first.y) % 2",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x3d);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&remaining_points);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&remaining_points);
  puts("--   erase 2");
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&remaining_points,t.root);
  while( true ) {
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(&__end1,(Node *)0x0);
    bVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                       ((Iterator *)&remaining_points,&__end1);
    std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                    *)&__end1);
    if (!bVar11) break;
    __end1.pending.
    super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT44(local_168.x._4_4_,local_168.x._0_4_);
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::count(&points,(key_type *)&__end1);
    phosg::expect_generic
              (sVar7 == 1,"1 != points.count(make_pair(it->first.x, it->first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x45);
    if ((((long)CONCAT44(local_168.x._4_4_,local_168.x._0_4_) < 0xfa) ||
        (0x2ed < CONCAT44(local_168.x._4_4_,local_168.x._0_4_))) ||
       (499 < CONCAT44(aaStack_160[0].y._4_4_,(undefined4)aaStack_160[0].y) - 0xfaU)) {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&remaining_points)
      ;
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance(&t,(Iterator *)&remaining_points);
    }
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&remaining_points);
  sVar2 = t.node_count;
  pFVar1 = _stderr;
  sVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::depth(&t);
  fprintf(pFVar1,"--     tree: size=%zu, depth=%zu\n",sVar2,sVar5);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&remaining_points,t.root);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(&__end1,(Node *)0x0);
  while (bVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                            ((Iterator *)&remaining_points,&__end1), bVar11) {
    local_1c8.x._4_4_ = local_168.x._4_4_;
    local_1c8.x._0_4_ = local_168.x._0_4_;
    ppNStack_1c0 = (Node **)CONCAT44(aaStack_160[0].y._4_4_,(undefined4)aaStack_160[0].y);
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::count(&points,(key_type *)&local_1c8);
    phosg::expect_generic
              (sVar7 == 1,"1 != points.count(make_pair(it.first.x, it.first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x4f);
    phosg::expect_generic
              (((undefined4)aaStack_160[0].y + local_168.x._0_4_ & 1) == 0,
               "0 != (it.first.x + it.first.y) % 2",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x50);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&remaining_points);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&remaining_points);
  remaining_points._M_t._M_impl._0_8_ = 0xfa;
  remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xfa;
  remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x2ee;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0x2ee;
  bVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                     (&t,(Vector2<long> *)&remaining_points,(Vector2<long> *)&__end1);
  phosg::expect_generic
            (!bVar11,"false != t.exists({250, 250}, {750, 750})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x54);
  remaining_points._M_t._M_impl._0_8_ = 0;
  remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  remaining_points._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x3e8;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 1000;
  bVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                     (&t,(Vector2<long> *)&remaining_points,(Vector2<long> *)&__end1);
  phosg::expect_generic
            (bVar11,"true != t.exists({0, 0}, {1000, 1000})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x55);
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~_Rb_tree(&points._M_t);
  phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree(&t);
  return;
}

Assistant:

void run_randomized_test() {
  printf("-- randomized\n");

  printf("--   construction/insert\n");
  srand(time(nullptr));
  KDTree<Vector2<int64_t>, int64_t> t;
  set<pair<int64_t, int64_t>> points;
  while (points.size() < 1000) {
    int64_t x = rand() % 1000;
    int64_t y = rand() % 1000;
    if (points.emplace(make_pair(x, y)).second) {
      t.insert({x, y}, x * y);
    }
  }
  fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());

  printf("--   within\n");
  {
    set<pair<int64_t, int64_t>> remaining_points = points;
    for (const auto& it : t.within({250, 250}, {750, 750})) {
      expect_ge(it.first.x, 250);
      expect_lt(it.first.x, 750);
      expect_ge(it.first.y, 250);
      expect_lt(it.first.y, 750);
      expect_eq(1, remaining_points.erase(make_pair(it.first.x, it.first.y)));
    }
    for (const auto& it : remaining_points) {
      expect((it.first < 250) || (it.first >= 750) || (it.second < 250) || (it.second >= 750));
    }
  }

  printf("--   erase 1\n");
  {
    // delete all points where x + y is an odd number
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, points.count(make_pair(it->first.x, it->first.y)));
      if ((it->first.x + it->first.y) % 2) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());
    for (auto it : t) {
      expect_eq(1, points.count(make_pair(it.first.x, it.first.y)));
      expect_eq(0, (it.first.x + it.first.y) % 2);
    }
  }

  printf("--   erase 2\n");
  {
    // delete all points in (250, 250) -> (750, 750)
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, points.count(make_pair(it->first.x, it->first.y)));
      if ((it->first.x >= 250) && (it->first.y >= 250) &&
          (it->first.x < 750) && (it->first.y < 750)) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());
    for (auto it : t) {
      expect_eq(1, points.count(make_pair(it.first.x, it.first.y)));
      expect_eq(0, (it.first.x + it.first.y) % 2);
    }
  }

  expect_eq(false, t.exists({250, 250}, {750, 750}));
  expect_eq(true, t.exists({0, 0}, {1000, 1000}));
}